

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::move_from(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *this,flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                  *other)

{
  pointer_type pcVar1;
  
  clear(this);
  (this->buffer_).v2_.end = (other->buffer_).v2_.end;
  pcVar1 = (other->buffer_).v2_.last;
  (this->buffer_).v2_.begin = (other->buffer_).v2_.begin;
  (this->buffer_).v2_.last = pcVar1;
  (other->buffer_).v2_.begin = (pointer_type)0x0;
  (other->buffer_).v2_.last = (pointer_type)0x0;
  (other->buffer_).v2_.end = (pointer_type)0x0;
  return;
}

Assistant:

void move_from(flat_forward_list &&other) noexcept {
        clear();
        buff().begin = other.buff().begin;
        buff().end = other.buff().end;
        buff().last = other.buff().last;
        other.buff().begin = nullptr;
        other.buff().end = nullptr;
        other.buff().last = nullptr;
    }